

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator>::WriteVectorInternal<true>
          (StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  idx_t i;
  Allocator *pAVar1;
  long lVar2;
  idx_t iVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  NumericStatisticsState<long,_long,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  ValidityMask *mask;
  idx_t r;
  Vector *pVVar6;
  long target_value;
  _func_int **local_58 [2];
  _func_int *local_48 [2];
  StandardColumnWriter<long,_long,_duckdb::ParquetCastOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_00259ac9_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar6 = *(Vector **)(input_column + 0x20);
  mask = (ValidityMask *)(input_column + 0x28);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)mask == 0) {
      TemplatedWritePlain<long,long,duckdb::ParquetCastOperator,true>
                (pVVar6,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<long,long,duckdb::ParquetCastOperator,false>
              (pVVar6,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_00259ac9_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar3 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar4 = iVar3, (*(ulong *)(*(long *)mask + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) != 0
           )) {
          local_58[0] = *(_func_int ***)(pVVar6 + iVar4 * 8);
          if ((long)local_58[0] < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = local_58[0];
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58[0]) {
            stats[2]._vptr_ColumnWriterStatistics = local_58[0];
          }
          DbpEncoder::BeginWriteInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar4 + 1;
          goto LAB_00259df7;
        }
        iVar3 = iVar3 + 1;
      } while (chunk_end != iVar3);
    }
    else {
LAB_00259df7:
      if (chunk_start < chunk_end) {
        do {
          local_58[0] = *(_func_int ***)(pVVar6 + chunk_start * 8);
          if ((long)local_58[0] < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = local_58[0];
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58[0]) {
            stats[2]._vptr_ColumnWriterStatistics = local_58[0];
          }
          DbpEncoder::WriteValueInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar3 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar4 = iVar3, (*(ulong *)(*(long *)mask + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) != 0
           )) {
          local_58[0] = *(_func_int ***)(pVVar6 + iVar4 * 8);
          if ((long)local_58[0] < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = local_58[0];
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58[0]) {
            stats[2]._vptr_ColumnWriterStatistics = local_58[0];
          }
          pAVar1 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<long>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar1,temp_writer,(long *)local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar4 + 1;
          goto LAB_00259ceb;
        }
        iVar3 = iVar3 + 1;
      } while (chunk_end != iVar3);
    }
    else {
LAB_00259ceb:
      if (chunk_start < chunk_end) {
        do {
          local_58[0] = *(_func_int ***)(pVVar6 + chunk_start * 8);
          if ((long)local_58[0] < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = local_58[0];
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58[0]) {
            stats[2]._vptr_ColumnWriterStatistics = local_58[0];
          }
          DlbaEncoder::WriteValue<long>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(long *)local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar3 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar4 = chunk_start;
      do {
        iVar3 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar3 = iVar4, (*(ulong *)(*(long *)mask + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0
           )) {
          local_58[0] = (_func_int **)
                        CONCAT71(local_58[0]._1_7_,
                                 *(undefined1 *)
                                  ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_00259d72;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_00259d72:
      lVar2 = chunk_end - iVar3;
      if (iVar3 <= chunk_end && lVar2 != 0) {
        pVVar6 = pVVar6 + iVar3 * 8;
        do {
          ppVar5 = PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::Lookup
                             ((PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *)
                              page_state_p[0x121b]._vptr_ColumnWriterPageState,(long *)pVVar6);
          local_58[0] = (_func_int **)CONCAT44(local_58[0]._4_4_,ppVar5->index);
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)local_58);
          pVVar6 = pVVar6 + 8;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar1 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar1);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        local_58[0] = *(_func_int ***)(pVVar6 + chunk_start * 8);
        if ((long)local_58[0] < (long)stats[1]._vptr_ColumnWriterStatistics) {
          stats[1]._vptr_ColumnWriterStatistics = local_58[0];
        }
        if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58[0]) {
          stats[2]._vptr_ColumnWriterStatistics = local_58[0];
        }
        lVar2 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar2 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)local_58 + lVar2);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}